

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O3

int IDAGetCurrentTime(void *ida_mem,sunrealtype *tcur)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x47b,"IDAGetCurrentTime",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    *tcur = *(sunrealtype *)((long)ida_mem + 0x2a8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetCurrentTime(void* ida_mem, sunrealtype* tcur)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *tcur = IDA_mem->ida_tn;

  return (IDA_SUCCESS);
}